

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  cmCTestSubmitHandler *pcVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  char *local_360;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> local_288;
  cmCTestSubmitHandler *local_258;
  cmCTestSubmitHandler *handler;
  string local_248;
  allocator<char> local_221;
  string local_220;
  undefined1 local_200 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraFiles;
  string local_1e0;
  char *local_1c0;
  char *extraFilesVariable;
  string local_1b0;
  undefined1 local_190 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  notesFiles;
  string local_170;
  char *local_150;
  char *notesFilesVariable;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *submitURL;
  cmCTestSubmitCommand *this_local;
  
  submitURL = (char *)this;
  uVar5 = std::__cxx11::string::empty();
  local_42 = 0;
  local_55 = 0;
  if ((uVar5 & 1) == 0) {
    local_360 = (char *)std::__cxx11::string::c_str();
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CTEST_SUBMIT_URL",&local_41);
    local_55 = 1;
    local_360 = cmMakefile::GetDefinition(pcVar1,&local_40);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  local_20 = local_360;
  if (local_360 == (char *)0x0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CTEST_DROP_METHOD",&local_79);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropMethod",&local_78,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CTEST_DROP_SITE_USER",&local_a1);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSiteUser",&local_a0,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CTEST_DROP_SITE_PASSWORD",&local_c9);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSitePassword",&local_c8,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CTEST_DROP_SITE",&local_f1);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSite",&local_f0,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CTEST_DROP_LOCATION",&local_119);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropLocation",&local_118,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  else {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"SubmitURL",local_360,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CTEST_CURL_OPTIONS",
             (allocator<char> *)((long)&notesFilesVariable + 7));
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CurlOptions",&local_140,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&notesFilesVariable + 7));
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CTEST_NOTES_FILES",
             (allocator<char> *)
             ((long)&notesFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&notesFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_150 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_190);
    pcVar6 = local_150;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar6,(allocator<char> *)((long)&extraFilesVariable + 7));
    cmSystemTools::ExpandListArgument
              (&local_1b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_190,false);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&extraFilesVariable + 7));
    cmCTest::GenerateNotesFile
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_190);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_190);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CTEST_EXTRA_SUBMIT_FILES",
             (allocator<char> *)
             ((long)&extraFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&extraFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1c0 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_200);
    pcVar6 = local_1c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,pcVar6,&local_221);
    cmSystemTools::ExpandListArgument
              (&local_220,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_200,false);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    bVar4 = cmCTest::SubmitExtraFiles
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_200);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"problem submitting extra files.",
                 (allocator<char> *)((long)&handler + 7));
      cmCommand::SetError((cmCommand *)this,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
      this_local = (cmCTestSubmitCommand *)0x0;
    }
    handler._0_4_ = (uint)!bVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_200);
    if ((uint)handler != 0) {
      return (cmCTestGenericHandler *)this_local;
    }
  }
  local_258 = cmCTest::GetSubmitHandler
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(local_258->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])();
  pcVar3 = local_258;
  if ((this->FilesMentioned & 1U) != 0) {
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_288._M_t._M_impl._0_8_ = 0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::set
              (&local_288);
    cmCTestSubmitHandler::SelectParts(pcVar3,&local_288);
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::~set
              (&local_288);
    cmCTestSubmitHandler::SelectFiles(local_258,&this->Files);
  }
  if ((this->PartsMentioned & 1U) != 0) {
    cmCTestSubmitHandler::SelectParts(local_258,&this->Parts);
  }
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->HttpHeaders);
  if (!bVar4) {
    cmCTestSubmitHandler::SetHttpHeaders(local_258,&this->HttpHeaders);
  }
  pcVar3 = local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"RetryDelay",&local_2a9);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_2a8,pcVar6);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  pcVar3 = local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"RetryCount",&local_2d1);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_2d0,pcVar6);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  pcVar3 = local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"InternalTest",&local_2f9)
  ;
  pcVar6 = "OFF";
  if ((this->InternalTest & 1U) != 0) {
    pcVar6 = "ON";
  }
  cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_2f8,pcVar6);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  cmCTestGenericHandler::SetQuiet
            (&local_258->super_cmCTestGenericHandler,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  pcVar3 = local_258;
  if ((this->CDashUpload & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"CDashUploadFile",&local_321);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_320,pcVar6);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    pcVar3 = local_258;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"CDashUploadType",&local_349);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_348,pcVar6);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  return &local_258->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  const char* submitURL = !this->SubmitURL.empty()
    ? this->SubmitURL.c_str()
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);

  const char* notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    std::vector<std::string> notesFiles;
    cmSystemTools::ExpandListArgument(notesFilesVariable, notesFiles);
    this->CTest->GenerateNotesFile(notesFiles);
  }

  const char* extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    std::vector<std::string> extraFiles;
    cmSystemTools::ExpandListArgument(extraFilesVariable, extraFiles);
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   FilesMentioned block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->FilesMentioned) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(this->Files);
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->PartsMentioned) {
    handler->SelectParts(this->Parts);
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay.c_str());
  handler->SetOption("RetryCount", this->RetryCount.c_str());
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile.c_str());
    handler->SetOption("CDashUploadType", this->CDashUploadType.c_str());
  }
  return handler;
}